

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_fb33fd::HandleInsertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  unsigned_long val;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view separator;
  string_view value_00;
  int item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string value;
  int local_15c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  string local_138;
  undefined8 local_118;
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  pointer pcStack_100;
  undefined8 local_f8;
  char *local_f0;
  pointer local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *local_d0;
  string local_c8;
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  cmAlphaNum local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"sub-command INSERT requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_a8._16_8_ = local_138.field_2._M_allocated_capacity;
    local_a8._0_8_ = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) {
      return false;
    }
LAB_0032d6cb:
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    return false;
  }
  bVar2 = GetIndexArg(pbVar1 + 2,&local_15c,status->Makefile);
  if (!bVar2) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_138.field_2._8_8_ = pbVar1[2]._M_dataplus._M_p;
    local_138.field_2._M_allocated_capacity = pbVar1[2]._M_string_length;
    local_138._M_dataplus._M_p = (pointer)0x7;
    local_138._M_string_length = 0x71099b;
    local_118 = 0x15;
    local_110 = " is not a valid index";
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_138;
    cmCatViews_abi_cxx11_((string *)local_a8,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_a8._0_8_ == local_a8 + 0x10) {
      return false;
    }
    goto LAB_0032d6cb;
  }
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = GetList(&local_158,pbVar1 + 1,status->Makefile);
  if (((bVar2) &&
      (local_158.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_158.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) || (local_15c == 0)) {
    if (local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar3 = (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (local_15c < 0) {
        local_15c = local_15c + (int)uVar3;
      }
      if (((long)local_15c < 0) || (uVar3 < (ulong)(long)local_15c)) {
        cmAlphaNum::cmAlphaNum(&local_48,local_15c);
        val = (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_138._M_dataplus._M_p = (char *)0x7;
        local_138._M_string_length = 0x71099b;
        local_138.field_2._M_allocated_capacity = local_48.View_._M_len;
        local_138.field_2._8_8_ = local_48.View_._M_str;
        local_118 = 0x10;
        local_110 = " out of range (-";
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a8,val);
        local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._0_8_;
        pcStack_100 = (pointer)local_a8._8_8_;
        local_f8 = 2;
        local_f0 = ", ";
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_78,val);
        local_e8 = (pointer)local_78._0_8_;
        pcStack_e0 = (char *)local_78._8_8_;
        local_d8 = 1;
        local_d0 = ")";
        views_01._M_len = 7;
        views_01._M_array = (iterator)&local_138;
        cmCatViews_abi_cxx11_(&local_c8,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_0032d642;
        goto LAB_0032d64a;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_15c,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin(&local_138,&local_158,separator,(string_view)ZEXT816(0));
    value_00._M_str = local_138._M_dataplus._M_p;
    value_00._M_len = local_138._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 1,value_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    bVar2 = true;
  }
  else {
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a8,local_15c);
    local_138._M_dataplus._M_p = (char *)0x7;
    local_138._M_string_length = 0x71099b;
    local_138.field_2._M_allocated_capacity = local_a8._0_8_;
    local_138.field_2._8_8_ = local_a8._8_8_;
    local_118 = 0x14;
    local_110 = " out of range (0, 0)";
    views._M_len = 3;
    views._M_array = (iterator)&local_138;
    cmCatViews_abi_cxx11_((string *)local_78,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_c8.field_2._M_allocated_capacity = local_78._16_8_;
    local_c8._M_dataplus._M_p = (pointer)local_78._0_8_;
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
LAB_0032d642:
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
LAB_0032d64a:
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return bVar2;
}

Assistant:

bool HandleInsertCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command INSERT requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];

  // expand the variable
  int item;
  if (!GetIndexArg(args[2], &item, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  std::vector<std::string> varArgsExpanded;
  if ((!GetList(varArgsExpanded, listName, status.GetMakefile()) ||
       varArgsExpanded.empty()) &&
      item != 0) {
    status.SetError(cmStrCat("index: ", item, " out of range (0, 0)"));
    return false;
  }

  if (!varArgsExpanded.empty()) {
    size_t nitem = varArgsExpanded.size();
    if (item < 0) {
      item = static_cast<int>(nitem) + item;
    }
    if (item < 0 || nitem < static_cast<size_t>(item)) {
      status.SetError(cmStrCat("index: ", item, " out of range (-",
                               varArgsExpanded.size(), ", ",
                               varArgsExpanded.size(), ")"));
      return false;
    }
  }

  varArgsExpanded.insert(varArgsExpanded.begin() + item, args.begin() + 3,
                         args.end());

  std::string value = cmJoin(varArgsExpanded, ";");
  status.GetMakefile().AddDefinition(listName, value);
  return true;
}